

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O2

void nn_bipc_start_listening(nn_bipc *self)

{
  nn_usock *self_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  uint *puVar6;
  FILE *pFVar7;
  undefined8 uVar8;
  sockaddr local_a0 [6];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  pcVar4 = nn_epbase_getaddr(&self->epbase);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  sVar5 = strlen(pcVar4);
  if (0x6b < sVar5) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","strlen (addr) < sizeof (un->sun_path)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
            ,0x18a);
    goto LAB_00122506;
  }
  local_a0[0].sa_family = 1;
  strncpy(local_a0[0].sa_data,pcVar4,0x6c);
  iVar2 = socket(1,1,0);
  if (iVar2 < 0) goto LAB_001223a8;
  iVar3 = fcntl(iVar2,4,0x800);
  if (iVar3 == -1) {
    puVar6 = (uint *)__errno_location();
    pFVar7 = _stderr;
    if (*puVar6 == 0x16) goto LAB_00122360;
    pcVar4 = nn_err_strerror(*puVar6);
    uVar1 = *puVar6;
    uVar8 = 0x196;
  }
  else {
LAB_00122360:
    iVar3 = connect(iVar2,local_a0,0x6e);
    if ((((iVar3 != -1) || (puVar6 = (uint *)__errno_location(), *puVar6 != 0x6f)) ||
        (iVar3 = unlink(pcVar4), pFVar7 = _stderr, iVar3 == 0)) || (*puVar6 == 2)) {
      iVar2 = close(iVar2);
      pFVar7 = _stderr;
      if (iVar2 == 0) {
LAB_001223a8:
        self_00 = &self->usock;
        iVar2 = nn_usock_start(self_00,1,1,0);
        if (iVar2 < 0) {
          nn_backoff_start(&self->retry);
          self->state = 7;
        }
        else {
          iVar2 = nn_usock_bind(self_00,(sockaddr *)local_a0,0x6e);
          if ((-1 < iVar2) && (iVar2 = nn_usock_listen(self_00,10), -1 < iVar2)) {
            nn_bipc_start_accepting(self);
            self->state = 2;
            return;
          }
          nn_usock_stop(self_00);
          self->state = 8;
        }
        return;
      }
      puVar6 = (uint *)__errno_location();
      pcVar4 = nn_err_strerror(*puVar6);
      fprintf(pFVar7,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar6,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
              ,0x19e);
      goto LAB_00122506;
    }
    pcVar4 = nn_err_strerror(*puVar6);
    uVar1 = *puVar6;
    uVar8 = 0x19b;
  }
  fprintf(pFVar7,"%s [%d] (%s:%d)\n",pcVar4,(ulong)uVar1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
          ,uVar8);
LAB_00122506:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_bipc_start_listening (struct nn_bipc *self)
{
    int rc;
    struct sockaddr_storage ss;
    struct sockaddr_un *un;
    const char *addr;
#if !defined NN_HAVE_WINDOWS
    int fd;
#endif

    /*  First, create the AF_UNIX address. */
    addr = nn_epbase_getaddr (&self->epbase);
    memset (&ss, 0, sizeof (ss));
    un = (struct sockaddr_un*) &ss;
    nn_assert (strlen (addr) < sizeof (un->sun_path));
    ss.ss_family = AF_UNIX;
    strncpy (un->sun_path, addr, sizeof (un->sun_path));

    /*  Delete the IPC file left over by eventual previous runs of
        the application. We'll check whether the file is still in use by
        connecting to the endpoint. On Windows plaform, NamedPipe is used
        which does not have an underlying file. */
#if !defined NN_HAVE_WINDOWS
    fd = socket (AF_UNIX, SOCK_STREAM, 0);
    if (fd >= 0) {
        rc = fcntl (fd, F_SETFL, O_NONBLOCK);
        errno_assert (rc != -1 || errno == EINVAL);
        rc = connect (fd, (struct sockaddr*) &ss,
            sizeof (struct sockaddr_un));
        if (rc == -1 && errno == ECONNREFUSED) {
            rc = unlink (addr);
            errno_assert (rc == 0 || errno == ENOENT);
        }
        rc = close (fd);
        errno_assert (rc == 0);
    }
#endif

    /*  Start listening for incoming connections. */
    rc = nn_usock_start (&self->usock, AF_UNIX, SOCK_STREAM, 0);
    if (nn_slow (rc < 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_BIPC_STATE_WAITING;
        return;
    }

    rc = nn_usock_bind (&self->usock,
        (struct sockaddr*) &ss, sizeof (struct sockaddr_un));
    if (nn_slow (rc < 0)) {
        nn_usock_stop (&self->usock);
        self->state = NN_BIPC_STATE_CLOSING;
        return;
    }

    rc = nn_usock_listen (&self->usock, NN_BIPC_BACKLOG);
    if (nn_slow (rc < 0)) {
        nn_usock_stop (&self->usock);
        self->state = NN_BIPC_STATE_CLOSING;
        return;
    }
    nn_bipc_start_accepting (self);
    self->state = NN_BIPC_STATE_ACTIVE;
}